

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall PClassPlayerPawn::DeriveData(PClassPlayerPawn *this,PClass *newclass)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = DObject::IsKindOf((DObject *)newclass,RegistrationInfo.MyClass);
  if (bVar1) {
    PClassActor::DeriveData(&this->super_PClassActor,newclass);
    FString::operator=((FString *)&newclass[1].FlatPointers,&this->DisplayName);
    FString::operator=((FString *)&newclass[1].Defaults,&this->SoundClass);
    FString::operator=((FString *)&newclass[1].bRuntimeClass,&this->Face);
    *(int *)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.Symbols.Symbols.Nodes = (this->InvulMode).Index;
    *(int *)((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.Symbols.Symbols + 4) =
         (this->HealingRadiusType).Index;
    *(BYTE *)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Conversions.Array = this->ColorRangeStart;
    *(BYTE *)((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                     super_PCompoundType.super_PType.Conversions.Array + 1) = this->ColorRangeEnd;
    TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::operator=
              ((TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *)
               &newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                super_PType.Conversions.Most,&this->ColorSets);
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      *(double *)
       ((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.Symbols.Symbols + lVar2 * 8 + 8U) = this->HexenArmor[lVar2];
    }
    for (lVar2 = 0; lVar2 != 0x50; lVar2 = lVar2 + 8) {
      FString::operator=((FString *)((long)&newclass[1].Virtuals.Most + lVar2),
                         (FString *)((long)&this->Slot[0].Chars + lVar2));
    }
    return;
  }
  __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x222,"virtual void PClassPlayerPawn::DeriveData(PClass *)");
}

Assistant:

void PClassPlayerPawn::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	Super::DeriveData(newclass);
	PClassPlayerPawn *newp = static_cast<PClassPlayerPawn *>(newclass);
	size_t i;

	newp->DisplayName = DisplayName;
	newp->SoundClass = SoundClass;
	newp->Face = Face;
	newp->InvulMode = InvulMode;
	newp->HealingRadiusType = HealingRadiusType;
	newp->ColorRangeStart = ColorRangeStart;
	newp->ColorRangeEnd = ColorRangeEnd;
	newp->ColorSets = ColorSets;
	for (i = 0; i < countof(HexenArmor); ++i)
	{
		newp->HexenArmor[i] = HexenArmor[i];
	}
	for (i = 0; i < countof(Slot); ++i)
	{
		newp->Slot[i] = Slot[i];
	}
}